

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O1

char * Diligent::Parsing::SkipDelimitersAndComments<char_const*>
                 (char **Start,char **End,char *Delimiters,SKIP_COMMENT_FLAGS CommentFlags)

{
  char *pcVar1;
  char *BlockStart;
  char *Pos;
  char *local_30;
  
  local_30 = *Start;
  while( true ) {
    pcVar1 = local_30;
    if (local_30 == *End) {
      return local_30;
    }
    if (*local_30 == '\0') break;
    local_30 = SkipDelimiters<char_const*>(&local_30,End,Delimiters);
    local_30 = SkipComment<char_const*>(&local_30,End,CommentFlags);
    if (local_30 == pcVar1) {
      return local_30;
    }
  }
  return local_30;
}

Assistant:

IteratorType SkipDelimitersAndComments(const IteratorType& Start,
                                       const IteratorType& End,
                                       const char*         Delimiters   = nullptr,
                                       SKIP_COMMENT_FLAGS  CommentFlags = SKIP_COMMENT_FLAG_ALL) noexcept(false)
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0')
    {
        const auto BlockStart = Pos;

        Pos = SkipDelimiters(Pos, End, Delimiters);
        Pos = SkipComment(Pos, End, CommentFlags); // May throw
        if (Pos == BlockStart)
            break;
    };

    return Pos;
}